

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_restore(CHAR_DATA *ch,char *argument)

{
  DESCRIPTOR_DATA *pDVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  CHAR_DATA *pCVar5;
  ROOM_INDEX_DATA *pRVar6;
  char *arg1;
  char *format;
  char arg [4608];
  char buf [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  pcVar4 = one_argument(argument,local_2438);
  if ((local_2438[0] == '\0') || (bVar2 = str_cmp(local_2438,"room"), !bVar2)) {
    pRVar6 = ch->in_room;
    pCVar5 = pRVar6->people;
    if (pCVar5 != (CHAR_DATA *)0x0) {
      do {
        switchD_002dea30::default(pCVar5,(int)gsn_plague);
        switchD_002dea30::default(pCVar5,(int)gsn_poison);
        switchD_002dea30::default(pCVar5,(int)gsn_blindness);
        switchD_002dea30::default(pCVar5,(int)gsn_sleep);
        switchD_002dea30::default(pCVar5,(int)gsn_curse);
        pCVar5->hit = (int)pCVar5->max_hit;
        pCVar5->mana = pCVar5->max_mana;
        pCVar5->move = pCVar5->max_move;
        bVar2 = is_npc(pCVar5);
        if (!bVar2) {
          update_pos(pCVar5);
        }
        act("$n has restored you.",ch,(void *)0x0,pCVar5,2);
        pCVar5 = pCVar5->next_in_room;
      } while (pCVar5 != (CHAR_DATA *)0x0);
      pRVar6 = ch->in_room;
    }
    sprintf(local_1238,"$N restored room %d.",(ulong)(uint)(int)pRVar6->vnum);
    iVar3 = get_trust(ch);
    wiznet(local_1238,ch,(OBJ_DATA *)0x0,0xf,0xc,iVar3);
    pcVar4 = "Room restored.\n\r";
  }
  else {
    iVar3 = get_trust(ch);
    if ((iVar3 < 0x3a) || (bVar2 = str_cmp(local_2438,"all"), pDVar1 = descriptor_list, bVar2)) {
      pCVar5 = get_char_world(ch,local_2438);
      if (pCVar5 == (CHAR_DATA *)0x0) {
        pcVar4 = "They aren\'t here.\n\r";
      }
      else {
        switchD_002dea30::default(pCVar5,(int)gsn_plague);
        switchD_002dea30::default(pCVar5,(int)gsn_poison);
        switchD_002dea30::default(pCVar5,(int)gsn_blindness);
        switchD_002dea30::default(pCVar5,(int)gsn_sleep);
        switchD_002dea30::default(pCVar5,(int)gsn_curse);
        pCVar5->hit = (int)pCVar5->max_hit;
        pCVar5->mana = pCVar5->max_mana;
        pCVar5->move = pCVar5->max_move;
        bVar2 = is_npc(pCVar5);
        if (!bVar2) {
          update_pos(pCVar5);
        }
        act("$n has restored you.",ch,(void *)0x0,pCVar5,2);
        bVar2 = is_npc(pCVar5);
        sprintf(local_1238,"$N restored %s",(&pCVar5->name)[(ulong)bVar2 * 4]);
        iVar3 = get_trust(ch);
        wiznet(local_1238,ch,(OBJ_DATA *)0x0,0xf,0xc,iVar3);
        pcVar4 = "Ok.\n\r";
      }
    }
    else {
      for (; pDVar1 != (DESCRIPTOR_DATA *)0x0; pDVar1 = pDVar1->next) {
        pCVar5 = pDVar1->character;
        if ((pCVar5 != (CHAR_DATA *)0x0) && (bVar2 = is_npc(pCVar5), !bVar2)) {
          switchD_002dea30::default(pCVar5,(int)gsn_plague);
          switchD_002dea30::default(pCVar5,(int)gsn_poison);
          switchD_002dea30::default(pCVar5,(int)gsn_blindness);
          switchD_002dea30::default(pCVar5,(int)gsn_sleep);
          switchD_002dea30::default(pCVar5,(int)gsn_curse);
          pCVar5->hit = (int)pCVar5->max_hit;
          pCVar5->mana = pCVar5->max_mana;
          pCVar5->move = pCVar5->max_move;
          bVar2 = is_npc(pCVar5);
          if (!bVar2) {
            update_pos(pCVar5);
          }
          if (pCVar5->in_room != (ROOM_INDEX_DATA *)0x0) {
            if ((pcVar4 == (char *)0x0) || (bVar2 = str_cmp(pcVar4,""), !bVar2)) {
              format = "$n has restored you.";
              arg1 = (char *)0x0;
            }
            else {
              format = "$t has restored you.";
              arg1 = pcVar4;
            }
            act(format,ch,arg1,pCVar5,2);
          }
        }
      }
      pcVar4 = "All active players restored.\n\r";
    }
  }
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_restore(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH], buf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;
	CHAR_DATA *vch;
	DESCRIPTOR_DATA *d;

	argument = one_argument(argument, arg);

	if (arg[0] == '\0' || !str_cmp(arg, "room"))
	{
		/* cure room */

		for (vch = ch->in_room->people; vch != nullptr; vch = vch->next_in_room)
		{
			affect_strip(vch, gsn_plague);
			affect_strip(vch, gsn_poison);
			affect_strip(vch, gsn_blindness);
			affect_strip(vch, gsn_sleep);
			affect_strip(vch, gsn_curse);

			vch->hit = vch->max_hit;
			vch->mana = vch->max_mana;
			vch->move = vch->max_move;

			if (!is_npc(vch))
				update_pos(vch);

			act("$n has restored you.", ch, nullptr, vch, TO_VICT);
		}

		sprintf(buf, "$N restored room %d.", ch->in_room->vnum);
		wiznet(buf, ch, nullptr, WIZ_RESTORE, WIZ_SECURE, get_trust(ch));

		send_to_char("Room restored.\n\r", ch);
		return;
	}

	if (get_trust(ch) >= MAX_LEVEL - 2 && !str_cmp(arg, "all"))
	{
		/* cure all */

		for (d = descriptor_list; d != nullptr; d = d->next)
		{
			victim = d->character;

			if (victim == nullptr || is_npc(victim))
				continue;

			affect_strip(victim, gsn_plague);
			affect_strip(victim, gsn_poison);
			affect_strip(victim, gsn_blindness);
			affect_strip(victim, gsn_sleep);
			affect_strip(victim, gsn_curse);

			victim->hit = victim->max_hit;
			victim->mana = victim->max_mana;
			victim->move = victim->max_move;

			if (!is_npc(victim))
				update_pos(victim);

			if (victim->in_room != nullptr)
			{
				if (!argument || !str_cmp(argument, ""))
					act("$n has restored you.", ch, nullptr, victim, TO_VICT);
				else
					act("$t has restored you.", ch, argument, victim, TO_VICT);
			}
		}

		send_to_char("All active players restored.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	affect_strip(victim, gsn_plague);
	affect_strip(victim, gsn_poison);
	affect_strip(victim, gsn_blindness);
	affect_strip(victim, gsn_sleep);
	affect_strip(victim, gsn_curse);

	victim->hit = victim->max_hit;
	victim->mana = victim->max_mana;
	victim->move = victim->max_move;

	if (!is_npc(victim))
		update_pos(victim);

	act("$n has restored you.", ch, nullptr, victim, TO_VICT);

	sprintf(buf, "$N restored %s", is_npc(victim) ? victim->short_descr : victim->name);
	wiznet(buf, ch, nullptr, WIZ_RESTORE, WIZ_SECURE, get_trust(ch));

	send_to_char("Ok.\n\r", ch);
}